

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O2

void drawFaces(Mat *img,vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *faces)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer pRVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  allocator<char> local_91;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  _InputArray local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"draw faces",(allocator<char> *)&local_60);
  cv::namedWindow((string *)&local_88,1);
  std::__cxx11::string::~string((string *)&local_88);
  lVar4 = 0xc;
  local_48 = 0;
  uStack_40 = 0x406fe00000000000;
  for (uVar5 = 0;
      pRVar3 = (faces->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl
               .super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(faces->
                            super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 4);
      uVar5 = uVar5 + 1) {
    uVar1 = *(undefined8 *)((long)pRVar3 + lVar4 + -0xc);
    uVar2 = *(undefined8 *)((long)pRVar3 + lVar4 + -4);
    local_68 = CONCAT44((int)((ulong)uVar2 >> 0x20) / 2 + (int)((ulong)uVar1 >> 0x20),
                        (int)uVar2 / 2 + (int)uVar1);
    local_60.sz.width = 0;
    local_60.sz.height = 0;
    local_60.flags = 0x3010000;
    local_90 = *(int *)((long)pRVar3 + lVar4 + -4) / 2;
    local_8c = (int)((double)*(int *)((long)&pRVar3->x + lVar4) / 1.5);
    local_60.obj = img;
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_88);
    local_88 = local_48;
    uStack_80 = uStack_40;
    local_78 = 0;
    uStack_70 = 0;
    cv::ellipse(&local_60,&local_68,&local_90,(string *)&local_88,2,8,0);
    lVar4 = lVar4 + 0x10;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"draw faces",&local_91);
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x1010000;
  local_60.obj = img;
  cv::imshow((string *)&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void drawFaces(Mat img, vector<Rect> faces) {
  namedWindow("draw faces");
  for (size_t i = 0; i < faces.size(); i++) {
    // 先确定人脸矩形中心坐标,再根据该坐标画椭圆
    Point center(faces[i].x + faces[i].width / 2,
                 faces[i].y + faces[i].height / 2);
    ellipse(img, center, Size(faces[i].width / 2, faces[i].height / 1.5), 0, 0,
            360, Scalar(0, 255, 0), 2, 8, 0);
  }
  imshow("draw faces", img);
}